

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1098::run(TestCase1098 *this)

{
  __off_t __length;
  uint i;
  long lVar1;
  Reader RVar2;
  size_t local_178;
  DebugComparison<int,_unsigned_long> _kjCondition;
  int local_144;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&_kjCondition,&message.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownDataField
            (&orphan,(Builder *)&_kjCondition);
  Orphan<capnp::Data>::truncate(&orphan,(char *)0x3,__length);
  RVar2 = OrphanBuilder::asDataReader(&orphan.builder);
  _kjCondition.right = RVar2.super_ArrayPtr<const_unsigned_char>.size_;
  _kjCondition.left = 3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 3;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_144 = 3;
    local_178 = _kjCondition.right;
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x451,ERROR,
               "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",&_kjCondition,&local_144,
               &local_178);
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    _kjCondition.left = 0;
    _kjCondition.right = (unsigned_long)(RVar2.super_ArrayPtr<const_unsigned_char>.ptr + lVar1);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = RVar2.super_ArrayPtr<const_unsigned_char>.ptr[lVar1] == '\0';
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_178 = local_178 & 0xffffffff00000000;
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_char_const&>&,int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x454,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",
                 (DebugComparison<int,_const_unsigned_char_&> *)&_kjCondition,(int *)&local_178,
                 (uchar *)_kjCondition.right);
    }
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendDataFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownDataField();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}